

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.hxx
# Opt level: O1

void __thiscall
vigra::ContractViolation::ContractViolation
          (ContractViolation *this,char *prefix,char *message,char *file,int line)

{
  ContractViolation *pCVar1;
  int local_34;
  char *local_30;
  char *local_28;
  char *local_20;
  
  *(undefined ***)this = &PTR__ContractViolation_0015ca50;
  (this->what_)._M_dataplus._M_p = (pointer)&(this->what_).field_2;
  (this->what_)._M_string_length = 0;
  (this->what_).field_2._M_local_buf[0] = '\0';
  local_34 = line;
  local_30 = file;
  local_28 = message;
  local_20 = prefix;
  pCVar1 = operator<<(this,(char (*) [2])0x14c9f9);
  pCVar1 = operator<<(pCVar1,&local_20);
  pCVar1 = operator<<(pCVar1,(char (*) [2])0x14c9f9);
  pCVar1 = operator<<(pCVar1,&local_28);
  pCVar1 = operator<<(pCVar1,(char (*) [3])"\n(");
  pCVar1 = operator<<(pCVar1,&local_30);
  pCVar1 = operator<<(pCVar1,(char (*) [2])":");
  pCVar1 = operator<<(pCVar1,&local_34);
  operator<<(pCVar1,(char (*) [3])")\n");
  return;
}

Assistant:

ContractViolation(char const * prefix, char const * message,
                      char const * file, int line)
    {
        (*this) << "\n" << prefix << "\n" << message << "\n("
                 << file << ":" << line << ")\n";
    }